

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynomial_test.hpp
# Opt level: O2

void TestPolyGraphDense<double>(Polynomial<double> *poly_graph)

{
  undefined1 *puVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  double dVar37;
  double dVar38;
  double dVar39;
  double dVar40;
  double dVar41;
  double lhs_value;
  bool bVar42;
  uint uVar43;
  char *pcVar44;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  initializer_list<unsigned_long> __l_01;
  initializer_list<unsigned_long> __l_02;
  initializer_list<unsigned_long> __l_03;
  initializer_list<unsigned_long> __l_04;
  initializer_list<unsigned_long> __l_05;
  initializer_list<unsigned_long> __l_06;
  initializer_list<unsigned_long> __l_07;
  initializer_list<unsigned_long> __l_08;
  initializer_list<unsigned_long> __l_09;
  initializer_list<unsigned_long> __l_10;
  initializer_list<unsigned_long> __l_11;
  initializer_list<unsigned_long> __l_12;
  initializer_list<unsigned_long> __l_13;
  initializer_list<unsigned_long> __l_14;
  initializer_list<unsigned_long> __l_15;
  initializer_list<unsigned_long> __l_16;
  Spins spins;
  Binaries binaries;
  AssertHelper local_2840;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_2838;
  AssertionResult gtest_ar_36;
  random_device rnd;
  mt19937 mt;
  
  mt._M_x[0] = (poly_graph->super_Graph)._num_spins;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&rnd,"poly_graph.size()","3",mt._M_x,(int *)&spins);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xcc,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  mt._M_x[0] = ((long)(poly_graph->poly_key_list_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(poly_graph->poly_key_list_).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,8);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&rnd,"poly_graph.get_num_interactions()","8",mt._M_x,(int *)&spins);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xcd,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  mt._M_x[0] = (long)(poly_graph->poly_value_list_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(poly_graph->poly_value_list_).
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start >> 3;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,8);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&rnd,"poly_graph.get_values().size()","8",mt._M_x,(int *)&spins);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xce,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  mt._M_x[0] = ((long)(poly_graph->poly_key_list_).
                      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
               (long)(poly_graph->poly_key_list_).
                     super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0x18;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)CONCAT44(spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start._4_4_,8);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)&rnd,"poly_graph.get_keys().size()","8",mt._M_x,(int *)&spins);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xcf,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  rnd.field_0.field_0._M_file = (void *)0x0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._M_mt._M_x[2] = 0;
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {} )","+0.1",dVar26,0.1);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd1,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  __l._M_len = 1;
  __l._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {0} )","-0.5",dVar26,-0.5);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd2,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_00,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {1} )","+1.0",dVar26,1.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd3,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x2;
  __l_01._M_len = 1;
  __l_01._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_01,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {2} )","-2.0",dVar26,-2.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd4,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x1;
  __l_02._M_len = 2;
  __l_02._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_02,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {0, 1} )","+10.0",dVar26,10.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd5,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2;
  __l_03._M_len = 2;
  __l_03._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_03,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {0, 2} )","-20.0",dVar26,-20.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd6,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x2;
  __l_04._M_len = 2;
  __l_04._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_04,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {1, 2} )","+21.0",dVar26,21.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd7,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  mt._M_x[0] = 0;
  mt._M_x[1] = 1;
  mt._M_x[2] = 2;
  __l_05._M_len = 3;
  __l_05._M_array = mt._M_x;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_05,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&spins,"poly_graph.J({0, 1, 2})","-120.0",dVar26,-120.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xd8,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mt,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mt);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x1;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  __l_06._M_len = 2;
  __l_06._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_06,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {1, 0} )","+10.0",dVar26,10.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xda,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x2;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  __l_07._M_len = 2;
  __l_07._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_07,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {2, 0} )","-20.0",dVar26,-20.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdb,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x2;
  spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x1;
  __l_08._M_len = 2;
  __l_08._M_array = (iterator)&spins;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_08,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&mt,"poly_graph.J( {2, 1} )","+21.0",dVar26,21.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)mt._M_x[0] == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (mt._M_x[1] == 0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)mt._M_x[1];
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdc,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(mt._M_x + 1));
  mt._M_x[0] = 0;
  mt._M_x[1] = 2;
  mt._M_x[2] = 1;
  __l_09._M_len = 3;
  __l_09._M_array = mt._M_x;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_09,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&spins,"poly_graph.J({0, 2, 1})","-120.0",dVar26,-120.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdd,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mt,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mt);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  mt._M_x[0] = 1;
  mt._M_x[1] = 2;
  mt._M_x[2] = 0;
  __l_10._M_len = 3;
  __l_10._M_array = mt._M_x;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_10,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&spins,"poly_graph.J({1, 2, 0})","-120.0",dVar26,-120.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xde,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mt,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mt);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  mt._M_x[0] = 1;
  mt._M_x[1] = 0;
  mt._M_x[2] = 2;
  __l_11._M_len = 3;
  __l_11._M_array = mt._M_x;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_11,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&spins,"poly_graph.J({1, 0, 2})","-120.0",dVar26,-120.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xdf,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mt,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mt);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  mt._M_x[0] = 2;
  mt._M_x[1] = 1;
  mt._M_x[2] = 0;
  __l_12._M_len = 3;
  __l_12._M_array = mt._M_x;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_12,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&spins,"poly_graph.J({2, 1, 0})","-120.0",dVar26,-120.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe0,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mt,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mt);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  mt._M_x[0] = 2;
  mt._M_x[1] = 0;
  mt._M_x[2] = 1;
  __l_13._M_len = 3;
  __l_13._M_array = mt._M_x;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd,__l_13,
             (allocator_type *)&binaries);
  dVar26 = openjij::graph::Polynomial<double>::J
                     (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&spins,"poly_graph.J({2, 0, 1})","-120.0",dVar26,-120.0);
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&rnd);
  if ((char)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start == '\0') {
    testing::Message::Message((Message *)&rnd);
    if (spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish == (pointer)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_finish;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&mt,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe1,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&mt,(Message *)&rnd);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&mt);
    if (rnd.field_0.field_0._M_file != (void *)0x0) {
      (**(code **)(*rnd.field_0.field_0._M_file + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish);
  dVar26 = openjij::graph::Polynomial<double>::J<>(poly_graph);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( )","+0.1",dVar26,0.1);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe3,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int>(poly_graph,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 0 )","-0.5",dVar26,-0.5);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe4,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int>(poly_graph,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 1 )","+1.0",dVar26,1.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe5,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int>(poly_graph,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 2 )","-2.0",dVar26,-2.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe6,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 0, 1 )","+10.0",dVar26,10.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe7,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 0, 2 )","-20.0",dVar26,-20.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe8,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 1, 2 )","+21.0",dVar26,21.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xe9,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,1,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J(0, 1, 2)","-120.0",dVar26,-120.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xea,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 1, 0 )","+10.0",dVar26,10.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xec,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,2,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 2, 0 )","-20.0",dVar26,-20.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xed,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,2,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J( 2, 1 )","+21.0",dVar26,21.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xee,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,2,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J(0, 2, 1)","-120.0",dVar26,-120.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xef,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,1,2,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J(1, 2, 0)","-120.0",dVar26,-120.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf0,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,1,0,2);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J(1, 0, 2)","-120.0",dVar26,-120.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf1,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,2,1,0);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J(2, 1, 0)","-120.0",dVar26,-120.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf2,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  dVar26 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,2,0,1);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&rnd,"poly_graph.J(2, 0, 1)","-120.0",dVar26,-120.0);
  if (rnd.field_0._M_mt._M_x[0]._0_1_ == '\0') {
    testing::Message::Message((Message *)&mt);
    if (rnd.field_0.field_0._M_func == (_func_result_type_void_ptr *)0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)rnd.field_0.field_0._M_func;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&spins,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0xf3,pcVar44);
    testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
    if (mt._M_x[0] != 0) {
      (**(code **)(*(long *)mt._M_x[0] + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr((unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&rnd.field_0.field_0._M_func);
  puVar1 = (undefined1 *)((long)&rnd.field_0 + 0x10);
  rnd.field_0._M_mt._M_x[2] = 0;
  rnd.field_0._M_mt._M_x[3] = 0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._0_8_ = puVar1;
  bVar42 = testing::internal::AlwaysTrue();
  if (bVar42) {
    openjij::graph::Polynomial<double>::J<int>(poly_graph,500);
  }
  std::__cxx11::string::assign((char *)&rnd);
  testing::Message::Message((Message *)&mt);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&spins,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf5,(char *)rnd.field_0.field_0._M_file);
  testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
  if (mt._M_x[0] != 0) {
    (**(code **)(*(long *)mt._M_x[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&rnd);
  rnd.field_0._M_mt._M_x[2] = 0;
  rnd.field_0._M_mt._M_x[3] = 0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._0_8_ = puVar1;
  bVar42 = testing::internal::AlwaysTrue();
  if (bVar42) {
    openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,0);
  }
  std::__cxx11::string::assign((char *)&rnd);
  testing::Message::Message((Message *)&mt);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&spins,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf6,(char *)rnd.field_0.field_0._M_file);
  testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
  if (mt._M_x[0] != 0) {
    (**(code **)(*(long *)mt._M_x[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&rnd);
  rnd.field_0._M_mt._M_x[2] = 0;
  rnd.field_0._M_mt._M_x[3] = 0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._0_8_ = puVar1;
  bVar42 = testing::internal::AlwaysTrue();
  if (bVar42) {
    openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,2,1,1);
  }
  std::__cxx11::string::assign((char *)&rnd);
  testing::Message::Message((Message *)&mt);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&spins,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf7,(char *)rnd.field_0.field_0._M_file);
  testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
  if (mt._M_x[0] != 0) {
    (**(code **)(*(long *)mt._M_x[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&rnd);
  rnd.field_0._M_mt._M_x[2] = 0;
  rnd.field_0._M_mt._M_x[3] = 0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._0_8_ = puVar1;
  bVar42 = testing::internal::AlwaysTrue();
  if (bVar42) {
    spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x1f4;
    __l_14._M_len = 1;
    __l_14._M_array = (iterator)&spins;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mt,__l_14,
               (allocator_type *)&binaries);
    openjij::graph::Polynomial<double>::J
              (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mt);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&mt);
  }
  std::__cxx11::string::assign((char *)&rnd);
  testing::Message::Message((Message *)&mt);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&spins,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xf9,(char *)rnd.field_0.field_0._M_file);
  testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
  if (mt._M_x[0] != 0) {
    (**(code **)(*(long *)mt._M_x[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&rnd);
  rnd.field_0._M_mt._M_x[2] = 0;
  rnd.field_0._M_mt._M_x[3] = 0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._0_8_ = puVar1;
  bVar42 = testing::internal::AlwaysTrue();
  if (bVar42) {
    spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    __l_15._M_len = 2;
    __l_15._M_array = (iterator)&spins;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mt,__l_15,
               (allocator_type *)&binaries);
    openjij::graph::Polynomial<double>::J
              (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mt);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&mt);
  }
  std::__cxx11::string::assign((char *)&rnd);
  testing::Message::Message((Message *)&mt);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&spins,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xfa,(char *)rnd.field_0.field_0._M_file);
  testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
  if (mt._M_x[0] != 0) {
    (**(code **)(*(long *)mt._M_x[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&rnd);
  rnd.field_0._M_mt._M_x[2] = 0;
  rnd.field_0._M_mt._M_x[3] = 0;
  rnd.field_0.field_0._M_func = (_func_result_type_void_ptr *)0x0;
  rnd.field_0._0_8_ = puVar1;
  bVar42 = testing::internal::AlwaysTrue();
  if (bVar42) {
    spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x2;
    spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x1;
    spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x1;
    __l_16._M_len = 3;
    __l_16._M_array = (iterator)&spins;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mt,__l_16,
               (allocator_type *)&binaries);
    openjij::graph::Polynomial<double>::J
              (poly_graph,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&mt);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&mt);
  }
  std::__cxx11::string::assign((char *)&rnd);
  testing::Message::Message((Message *)&mt);
  testing::internal::AssertHelper::AssertHelper
            ((AssertHelper *)&spins,kNonFatalFailure,
             "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
             ,0xfb,(char *)rnd.field_0.field_0._M_file);
  testing::internal::AssertHelper::operator=((AssertHelper *)&spins,(Message *)&mt);
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&spins);
  if (mt._M_x[0] != 0) {
    (**(code **)(*(long *)mt._M_x[0] + 8))();
  }
  std::__cxx11::string::~string((string *)&rnd);
  std::random_device::random_device(&rnd);
  uVar43 = std::random_device::_M_getval();
  std::
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  ::seed(&mt,(ulong)uVar43);
  openjij::graph::Graph::
  gen_spin<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (&spins,&poly_graph->super_Graph,&mt);
  openjij::graph::Graph::
  gen_binary<std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
            (&binaries,&poly_graph->super_Graph,&mt);
  dVar26 = openjij::graph::Polynomial<double>::J<>(poly_graph);
  iVar2 = *spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  dVar27 = openjij::graph::Polynomial<double>::J<int>(poly_graph,0);
  iVar3 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
  dVar28 = openjij::graph::Polynomial<double>::J<int>(poly_graph,1);
  iVar4 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[2];
  dVar29 = openjij::graph::Polynomial<double>::J<int>(poly_graph,2);
  iVar5 = *spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar6 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
  dVar30 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,1);
  iVar7 = *spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start;
  iVar8 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[2];
  dVar31 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,2);
  iVar9 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start[1];
  iVar10 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  dVar32 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,2);
  iVar11 = *spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar12 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  iVar13 = spins.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  dVar33 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,1,2);
  dVar34 = openjij::graph::Polynomial<double>::J<>(poly_graph);
  iVar14 = *binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  dVar35 = openjij::graph::Polynomial<double>::J<int>(poly_graph,0);
  iVar15 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  dVar36 = openjij::graph::Polynomial<double>::J<int>(poly_graph,1);
  iVar16 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  dVar37 = openjij::graph::Polynomial<double>::J<int>(poly_graph,2);
  iVar17 = *binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar18 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  dVar38 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,1);
  iVar19 = *binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar20 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  dVar39 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,0,2);
  iVar21 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  iVar22 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  dVar40 = openjij::graph::Polynomial<double>::J<int,int>(poly_graph,1,2);
  iVar23 = *binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start;
  iVar24 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[1];
  iVar25 = binaries.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start[2];
  dVar41 = openjij::graph::Polynomial<double>::J<int,int,int>(poly_graph,0,1,2);
  lhs_value = openjij::graph::Polynomial<double>::energy(poly_graph,&spins,true);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_36,"poly_graph.energy(spins)","energy_spins",lhs_value,
             (double)(iVar12 * iVar11 * iVar13) * dVar33 +
             (double)(iVar10 * iVar9) * dVar32 +
             (double)(iVar8 * iVar7) * dVar31 +
             (double)(iVar6 * iVar5) * dVar30 +
             (double)iVar4 * dVar29 + (double)iVar3 * dVar28 + (double)iVar2 * dVar27 + dVar26 + 0.0
            );
  if (gtest_ar_36.success_ == false) {
    testing::Message::Message((Message *)&local_2838);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_36.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)gtest_ar_36.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0x117,pcVar44);
    testing::internal::AssertHelper::operator=(&local_2840,(Message *)&local_2838);
    testing::internal::AssertHelper::~AssertHelper(&local_2840);
    if (local_2838._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2838._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_36.message_);
  dVar26 = openjij::graph::Polynomial<double>::energy(poly_graph,&binaries,true);
  testing::internal::CmpHelperFloatingPointEQ<double>
            ((internal *)&gtest_ar_36,"poly_graph.energy(binaries)","energy_binaries",dVar26,
             (double)(iVar24 * iVar23 * iVar25) * dVar41 +
             (double)(iVar22 * iVar21) * dVar40 +
             (double)(iVar20 * iVar19) * dVar39 +
             (double)(iVar18 * iVar17) * dVar38 +
             (double)iVar16 * dVar37 +
             (double)iVar15 * dVar36 + (double)iVar14 * dVar35 + dVar34 + 0.0);
  if (gtest_ar_36.success_ == false) {
    testing::Message::Message((Message *)&local_2838);
    if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )gtest_ar_36.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl ==
        (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      pcVar44 = "";
    }
    else {
      pcVar44 = *(char **)gtest_ar_36.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_2840,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/OpenJij[P]OpenJij/tests/cxxtest/polynomial_test.hpp"
               ,0x118,pcVar44);
    testing::internal::AssertHelper::operator=(&local_2840,(Message *)&local_2838);
    testing::internal::AssertHelper::~AssertHelper(&local_2840);
    if (local_2838._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_2838._M_head_impl + 8))();
    }
  }
  std::
  unique_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~unique_ptr(&gtest_ar_36.message_);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&binaries.super__Vector_base<int,_std::allocator<int>_>);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&spins.super__Vector_base<int,_std::allocator<int>_>);
  std::random_device::~random_device(&rnd);
  return;
}

Assistant:

void TestPolyGraphDense(const openjij::graph::Polynomial<FloatType> &poly_graph) {
   EXPECT_EQ(poly_graph.size()                , 3);
   EXPECT_EQ(poly_graph.get_num_interactions(), 8);
   EXPECT_EQ(poly_graph.get_values().size()   , 8);
   EXPECT_EQ(poly_graph.get_keys().size()     , 8);
   
   EXPECT_DOUBLE_EQ(poly_graph.J(   {}    ), +0.1  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   {0}   ), -0.5  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   {1}   ), +1.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   {2}   ), -2.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J( {0, 1}  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {0, 2}  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {1, 2}  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J({0, 1, 2}), -120.0);
   
   EXPECT_DOUBLE_EQ(poly_graph.J( {1, 0}  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {2, 0}  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( {2, 1}  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J({0, 2, 1}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({1, 2, 0}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({1, 0, 2}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({2, 1, 0}), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J({2, 0, 1}), -120.0);
   
   EXPECT_DOUBLE_EQ(poly_graph.J(       ), +0.1  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   0   ), -0.5  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   1   ), +1.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J(   2   ), -2.0  );
   EXPECT_DOUBLE_EQ(poly_graph.J( 0, 1  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 0, 2  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 1, 2  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J(0, 1, 2), -120.0);
   
   EXPECT_DOUBLE_EQ(poly_graph.J( 1, 0  ), +10.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 2, 0  ), -20.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J( 2, 1  ), +21.0 );
   EXPECT_DOUBLE_EQ(poly_graph.J(0, 2, 1), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(1, 2, 0), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(1, 0, 2), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(2, 1, 0), -120.0);
   EXPECT_DOUBLE_EQ(poly_graph.J(2, 0, 1), -120.0);
   
   EXPECT_THROW(poly_graph.J(  500  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J( 0, 0  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J(2, 1, 1), std::runtime_error);
   
   EXPECT_THROW(poly_graph.J(  {500}  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J( {0, 0}  ), std::runtime_error);
   EXPECT_THROW(poly_graph.J({2, 1, 1}), std::runtime_error);
   
   std::random_device rnd;
   std::mt19937 mt(rnd());
   const auto spins    = poly_graph.gen_spin(mt);
   const auto binaries = poly_graph.gen_binary(mt);
   
   FloatType energy_spins    = 0.0;
   FloatType energy_binaries = 0.0;

   energy_spins += poly_graph.J();
   energy_spins += spins[0]*poly_graph.J(0);
   energy_spins += spins[1]*poly_graph.J(1);
   energy_spins += spins[2]*poly_graph.J(2);
   energy_spins += spins[0]*spins[1]*poly_graph.J(0,1);
   energy_spins += spins[0]*spins[2]*poly_graph.J(0,2);
   energy_spins += spins[1]*spins[2]*poly_graph.J(1,2);
   energy_spins += spins[0]*spins[1]*spins[2]*poly_graph.J(0,1,2);
   
   energy_binaries += poly_graph.J();
   energy_binaries += binaries[0]*poly_graph.J(0);
   energy_binaries += binaries[1]*poly_graph.J(1);
   energy_binaries += binaries[2]*poly_graph.J(2);
   energy_binaries += binaries[0]*binaries[1]*poly_graph.J(0,1);
   energy_binaries += binaries[0]*binaries[2]*poly_graph.J(0,2);
   energy_binaries += binaries[1]*binaries[2]*poly_graph.J(1,2);
   energy_binaries += binaries[0]*binaries[1]*binaries[2]*poly_graph.J(0,1,2);
   
   EXPECT_DOUBLE_EQ(poly_graph.energy(spins)   , energy_spins);
   EXPECT_DOUBLE_EQ(poly_graph.energy(binaries), energy_binaries);

}